

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

bool GetProxy(Network net,Proxy *proxyInfoOut)

{
  byte bVar1;
  undefined8 in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock6;
  GlobalMutex *in_stack_ffffffffffffffb8;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  GlobalMutex *in_stack_fffffffffffffff0;
  UniqueLock<GlobalMutex> *this;
  
  this = *(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28);
  uVar2 = in_EDI < 7;
  if (!(bool)uVar2) {
    __assert_fail("net >= 0 && net < NET_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x2b2,"bool GetProxy(enum Network, Proxy &)");
  }
  MaybeCheckNotHeld<GlobalMutex>(in_stack_ffffffffffffffb8);
  UniqueLock<GlobalMutex>::UniqueLock
            (this,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             (char *)CONCAT44(in_stack_ffffffffffffffe4,in_EDI),(int)((ulong)in_RSI >> 0x20),
             SUB81((ulong)in_RSI >> 0x18,0));
  bVar1 = Proxy::IsValid((Proxy *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffc6,
                                                          CONCAT15(in_stack_ffffffffffffffc5,
                                                                   in_stack_ffffffffffffffc0))));
  if ((bool)bVar1) {
    Proxy::operator=((Proxy *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (Proxy *)CONCAT17(uVar2,CONCAT16(bVar1,CONCAT15(in_stack_ffffffffffffffc5,
                                                                     in_stack_ffffffffffffffc0))));
  }
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffffb8);
  if (*(UniqueLock<GlobalMutex> **)(in_FS_OFFSET + 0x28) == this) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool GetProxy(enum Network net, Proxy &proxyInfoOut) {
    assert(net >= 0 && net < NET_MAX);
    LOCK(g_proxyinfo_mutex);
    if (!proxyInfo[net].IsValid())
        return false;
    proxyInfoOut = proxyInfo[net];
    return true;
}